

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmaster.c
# Opt level: O2

void finish_pass_master(j_compress_ptr cinfo)

{
  int *piVar1;
  int iVar2;
  jpeg_comp_master *pjVar3;
  
  pjVar3 = cinfo->master;
  (*cinfo->entropy->finish_pass)(cinfo);
  iVar2 = *(int *)&pjVar3[1].prepare_for_pass;
  if (iVar2 == 2) {
    if (cinfo->optimize_coding != 0) {
      *(undefined4 *)&pjVar3[1].prepare_for_pass = 1;
    }
  }
  else {
    if (iVar2 == 1) {
      *(undefined4 *)&pjVar3[1].prepare_for_pass = 2;
      goto LAB_0011ac15;
    }
    if ((iVar2 != 0) ||
       (*(undefined4 *)&pjVar3[1].prepare_for_pass = 2, cinfo->optimize_coding != 0))
    goto LAB_0011ac15;
  }
  piVar1 = (int *)((long)&pjVar3[1].pass_startup + 4);
  *piVar1 = *piVar1 + 1;
LAB_0011ac15:
  piVar1 = (int *)((long)&pjVar3[1].prepare_for_pass + 4);
  *piVar1 = *piVar1 + 1;
  return;
}

Assistant:

METHODDEF(void)
finish_pass_master(j_compress_ptr cinfo)
{
  my_master_ptr master = (my_master_ptr)cinfo->master;

  /* The entropy coder always needs an end-of-pass call,
   * either to analyze statistics or to flush its output buffer.
   */
  (*cinfo->entropy->finish_pass) (cinfo);

  /* Update state for next pass */
  switch (master->pass_type) {
  case main_pass:
    /* next pass is either output of scan 0 (after optimization)
     * or output of scan 1 (if no optimization).
     */
    master->pass_type = output_pass;
    if (!cinfo->optimize_coding)
      master->scan_number++;
    break;
  case huff_opt_pass:
    /* next pass is always output of current scan */
    master->pass_type = output_pass;
    break;
  case output_pass:
    /* next pass is either optimization or output of next scan */
    if (cinfo->optimize_coding)
      master->pass_type = huff_opt_pass;
    master->scan_number++;
    break;
  }

  master->pass_number++;
}